

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stats.c
# Opt level: O1

void mutex_stats_init_cols
               (emitter_row_t *row,char *table_name,emitter_col_t *name,emitter_col_t *col_uint64_t,
               emitter_col_t *col_uint32_t)

{
  emitter_col_t *peVar1;
  emitter_col_t *peVar2;
  emitter_col_t *peVar3;
  
  if (name != (emitter_col_t *)0x0) {
    (name->link).qre_next = name;
    (name->link).qre_prev = name;
    peVar1 = (row->cols).qlh_first;
    if (peVar1 != (emitter_col_t *)0x0) {
      (name->link).qre_next = (peVar1->link).qre_prev;
      (peVar1->link).qre_prev = name;
      peVar2 = (((name->link).qre_prev)->link).qre_next;
      (name->link).qre_prev = peVar2;
      (((peVar1->link).qre_prev)->link).qre_next = peVar1;
      (peVar2->link).qre_next = name;
    }
    (row->cols).qlh_first = (name->link).qre_next;
    name->justify = emitter_justify_left;
    name->width = 0x15;
    name->type = emitter_type_title;
    (name->field_3).str_val = table_name;
  }
  (col_uint64_t->link).qre_next = col_uint64_t;
  (col_uint64_t->link).qre_prev = col_uint64_t;
  peVar1 = (row->cols).qlh_first;
  if (peVar1 != (emitter_col_t *)0x0) {
    (col_uint64_t->link).qre_next = (peVar1->link).qre_prev;
    (peVar1->link).qre_prev = col_uint64_t;
    peVar2 = (((col_uint64_t->link).qre_prev)->link).qre_next;
    (col_uint64_t->link).qre_prev = peVar2;
    (((peVar1->link).qre_prev)->link).qre_next = peVar1;
    (peVar2->link).qre_next = col_uint64_t;
  }
  (row->cols).qlh_first = (col_uint64_t->link).qre_next;
  col_uint64_t->justify = emitter_justify_right;
  col_uint64_t->width = 0x10;
  col_uint64_t->type = emitter_type_title;
  (col_uint64_t->field_3).str_val = "n_lock_ops";
  peVar1 = col_uint64_t + 1;
  col_uint64_t[1].link.qre_next = peVar1;
  col_uint64_t[1].link.qre_prev = peVar1;
  peVar2 = (row->cols).qlh_first;
  if (peVar2 != (emitter_col_t *)0x0) {
    col_uint64_t[1].link.qre_next = (peVar2->link).qre_prev;
    (peVar2->link).qre_prev = peVar1;
    peVar3 = ((col_uint64_t[1].link.qre_prev)->link).qre_next;
    col_uint64_t[1].link.qre_prev = peVar3;
    (((peVar2->link).qre_prev)->link).qre_next = peVar2;
    (peVar3->link).qre_next = peVar1;
  }
  (row->cols).qlh_first = col_uint64_t[1].link.qre_next;
  col_uint64_t[1].justify = emitter_justify_right;
  col_uint64_t[1].width = 8;
  col_uint64_t[1].type = emitter_type_title;
  col_uint64_t[1].field_3.str_val = "(#/sec)";
  peVar1 = col_uint64_t + 2;
  col_uint64_t[2].link.qre_next = peVar1;
  col_uint64_t[2].link.qre_prev = peVar1;
  peVar2 = (row->cols).qlh_first;
  if (peVar2 != (emitter_col_t *)0x0) {
    col_uint64_t[2].link.qre_next = (peVar2->link).qre_prev;
    (peVar2->link).qre_prev = peVar1;
    peVar3 = ((col_uint64_t[2].link.qre_prev)->link).qre_next;
    col_uint64_t[2].link.qre_prev = peVar3;
    (((peVar2->link).qre_prev)->link).qre_next = peVar2;
    (peVar3->link).qre_next = peVar1;
  }
  (row->cols).qlh_first = col_uint64_t[2].link.qre_next;
  col_uint64_t[2].justify = emitter_justify_right;
  col_uint64_t[2].width = 0x10;
  col_uint64_t[2].type = emitter_type_title;
  col_uint64_t[2].field_3.str_val = "n_waiting";
  peVar1 = col_uint64_t + 3;
  col_uint64_t[3].link.qre_next = peVar1;
  col_uint64_t[3].link.qre_prev = peVar1;
  peVar2 = (row->cols).qlh_first;
  if (peVar2 != (emitter_col_t *)0x0) {
    col_uint64_t[3].link.qre_next = (peVar2->link).qre_prev;
    (peVar2->link).qre_prev = peVar1;
    peVar3 = ((col_uint64_t[3].link.qre_prev)->link).qre_next;
    col_uint64_t[3].link.qre_prev = peVar3;
    (((peVar2->link).qre_prev)->link).qre_next = peVar2;
    (peVar3->link).qre_next = peVar1;
  }
  (row->cols).qlh_first = col_uint64_t[3].link.qre_next;
  col_uint64_t[3].justify = emitter_justify_right;
  col_uint64_t[3].width = 8;
  col_uint64_t[3].type = emitter_type_title;
  col_uint64_t[3].field_3.str_val = "(#/sec)";
  peVar1 = col_uint64_t + 4;
  col_uint64_t[4].link.qre_next = peVar1;
  col_uint64_t[4].link.qre_prev = peVar1;
  peVar2 = (row->cols).qlh_first;
  if (peVar2 != (emitter_col_t *)0x0) {
    col_uint64_t[4].link.qre_next = (peVar2->link).qre_prev;
    (peVar2->link).qre_prev = peVar1;
    peVar3 = ((col_uint64_t[4].link.qre_prev)->link).qre_next;
    col_uint64_t[4].link.qre_prev = peVar3;
    (((peVar2->link).qre_prev)->link).qre_next = peVar2;
    (peVar3->link).qre_next = peVar1;
  }
  (row->cols).qlh_first = col_uint64_t[4].link.qre_next;
  col_uint64_t[4].justify = emitter_justify_right;
  col_uint64_t[4].width = 0x10;
  col_uint64_t[4].type = emitter_type_title;
  col_uint64_t[4].field_3.str_val = "n_spin_acq";
  peVar1 = col_uint64_t + 5;
  col_uint64_t[5].link.qre_next = peVar1;
  col_uint64_t[5].link.qre_prev = peVar1;
  peVar2 = (row->cols).qlh_first;
  if (peVar2 != (emitter_col_t *)0x0) {
    col_uint64_t[5].link.qre_next = (peVar2->link).qre_prev;
    (peVar2->link).qre_prev = peVar1;
    peVar3 = ((col_uint64_t[5].link.qre_prev)->link).qre_next;
    col_uint64_t[5].link.qre_prev = peVar3;
    (((peVar2->link).qre_prev)->link).qre_next = peVar2;
    (peVar3->link).qre_next = peVar1;
  }
  (row->cols).qlh_first = col_uint64_t[5].link.qre_next;
  col_uint64_t[5].justify = emitter_justify_right;
  col_uint64_t[5].width = 8;
  col_uint64_t[5].type = emitter_type_title;
  col_uint64_t[5].field_3.str_val = "(#/sec)";
  peVar1 = col_uint64_t + 6;
  col_uint64_t[6].link.qre_next = peVar1;
  col_uint64_t[6].link.qre_prev = peVar1;
  peVar2 = (row->cols).qlh_first;
  if (peVar2 != (emitter_col_t *)0x0) {
    col_uint64_t[6].link.qre_next = (peVar2->link).qre_prev;
    (peVar2->link).qre_prev = peVar1;
    peVar3 = ((col_uint64_t[6].link.qre_prev)->link).qre_next;
    col_uint64_t[6].link.qre_prev = peVar3;
    (((peVar2->link).qre_prev)->link).qre_next = peVar2;
    (peVar3->link).qre_next = peVar1;
  }
  (row->cols).qlh_first = col_uint64_t[6].link.qre_next;
  col_uint64_t[6].justify = emitter_justify_right;
  col_uint64_t[6].width = 0x10;
  col_uint64_t[6].type = emitter_type_title;
  col_uint64_t[6].field_3.str_val = "n_owner_switch";
  peVar1 = col_uint64_t + 7;
  col_uint64_t[7].link.qre_next = peVar1;
  col_uint64_t[7].link.qre_prev = peVar1;
  peVar2 = (row->cols).qlh_first;
  if (peVar2 != (emitter_col_t *)0x0) {
    col_uint64_t[7].link.qre_next = (peVar2->link).qre_prev;
    (peVar2->link).qre_prev = peVar1;
    peVar3 = ((col_uint64_t[7].link.qre_prev)->link).qre_next;
    col_uint64_t[7].link.qre_prev = peVar3;
    (((peVar2->link).qre_prev)->link).qre_next = peVar2;
    (peVar3->link).qre_next = peVar1;
  }
  (row->cols).qlh_first = col_uint64_t[7].link.qre_next;
  col_uint64_t[7].justify = emitter_justify_right;
  col_uint64_t[7].width = 8;
  col_uint64_t[7].type = emitter_type_title;
  col_uint64_t[7].field_3.str_val = "(#/sec)";
  peVar1 = col_uint64_t + 8;
  col_uint64_t[8].link.qre_next = peVar1;
  col_uint64_t[8].link.qre_prev = peVar1;
  peVar2 = (row->cols).qlh_first;
  if (peVar2 != (emitter_col_t *)0x0) {
    col_uint64_t[8].link.qre_next = (peVar2->link).qre_prev;
    (peVar2->link).qre_prev = peVar1;
    peVar3 = ((col_uint64_t[8].link.qre_prev)->link).qre_next;
    col_uint64_t[8].link.qre_prev = peVar3;
    (((peVar2->link).qre_prev)->link).qre_next = peVar2;
    (peVar3->link).qre_next = peVar1;
  }
  (row->cols).qlh_first = col_uint64_t[8].link.qre_next;
  col_uint64_t[8].justify = emitter_justify_right;
  col_uint64_t[8].width = 0x10;
  col_uint64_t[8].type = emitter_type_title;
  col_uint64_t[8].field_3.str_val = "total_wait_ns";
  peVar1 = col_uint64_t + 9;
  col_uint64_t[9].link.qre_next = peVar1;
  col_uint64_t[9].link.qre_prev = peVar1;
  peVar2 = (row->cols).qlh_first;
  if (peVar2 != (emitter_col_t *)0x0) {
    col_uint64_t[9].link.qre_next = (peVar2->link).qre_prev;
    (peVar2->link).qre_prev = peVar1;
    peVar3 = ((col_uint64_t[9].link.qre_prev)->link).qre_next;
    col_uint64_t[9].link.qre_prev = peVar3;
    (((peVar2->link).qre_prev)->link).qre_next = peVar2;
    (peVar3->link).qre_next = peVar1;
  }
  (row->cols).qlh_first = col_uint64_t[9].link.qre_next;
  col_uint64_t[9].justify = emitter_justify_right;
  col_uint64_t[9].width = 8;
  col_uint64_t[9].type = emitter_type_title;
  col_uint64_t[9].field_3.str_val = "(#/sec)";
  peVar1 = col_uint64_t + 10;
  col_uint64_t[10].link.qre_next = peVar1;
  col_uint64_t[10].link.qre_prev = peVar1;
  peVar2 = (row->cols).qlh_first;
  if (peVar2 != (emitter_col_t *)0x0) {
    col_uint64_t[10].link.qre_next = (peVar2->link).qre_prev;
    (peVar2->link).qre_prev = peVar1;
    peVar3 = ((col_uint64_t[10].link.qre_prev)->link).qre_next;
    col_uint64_t[10].link.qre_prev = peVar3;
    (((peVar2->link).qre_prev)->link).qre_next = peVar2;
    (peVar3->link).qre_next = peVar1;
  }
  (row->cols).qlh_first = col_uint64_t[10].link.qre_next;
  col_uint64_t[10].justify = emitter_justify_right;
  col_uint64_t[10].width = 0x10;
  col_uint64_t[10].type = emitter_type_title;
  col_uint64_t[10].field_3.str_val = "max_wait_ns";
  (col_uint32_t->link).qre_next = col_uint32_t;
  (col_uint32_t->link).qre_prev = col_uint32_t;
  peVar1 = (row->cols).qlh_first;
  if (peVar1 != (emitter_col_t *)0x0) {
    (col_uint32_t->link).qre_next = (peVar1->link).qre_prev;
    (peVar1->link).qre_prev = col_uint32_t;
    peVar2 = (((col_uint32_t->link).qre_prev)->link).qre_next;
    (col_uint32_t->link).qre_prev = peVar2;
    (((peVar1->link).qre_prev)->link).qre_next = peVar1;
    (peVar2->link).qre_next = col_uint32_t;
  }
  (row->cols).qlh_first = (col_uint32_t->link).qre_next;
  col_uint32_t->justify = emitter_justify_right;
  col_uint32_t->width = 0xc;
  col_uint32_t->type = emitter_type_title;
  (col_uint32_t->field_3).str_val = "max_n_thds";
  col_uint64_t[9].width = 10;
  return;
}

Assistant:

static void
mutex_stats_init_cols(emitter_row_t *row, const char *table_name,
    emitter_col_t *name,
    emitter_col_t col_uint64_t[mutex_prof_num_uint64_t_counters],
    emitter_col_t col_uint32_t[mutex_prof_num_uint32_t_counters]) {
	mutex_prof_uint64_t_counter_ind_t k_uint64_t = 0;
	mutex_prof_uint32_t_counter_ind_t k_uint32_t = 0;

	emitter_col_t *col;

	if (name != NULL) {
		emitter_col_init(name, row);
		name->justify = emitter_justify_left;
		name->width = 21;
		name->type = emitter_type_title;
		name->str_val = table_name;
	}

#define WIDTH_uint32_t 12
#define WIDTH_uint64_t 16
#define OP(counter, counter_type, human, derived, base_counter)		\
	col = &col_##counter_type[k_##counter_type];			\
	++k_##counter_type;						\
	emitter_col_init(col, row);					\
	col->justify = emitter_justify_right;				\
	col->width = derived ? 8 : WIDTH_##counter_type;		\
	col->type = emitter_type_title;					\
	col->str_val = human;
	MUTEX_PROF_COUNTERS
#undef OP
#undef WIDTH_uint32_t
#undef WIDTH_uint64_t
	col_uint64_t[mutex_counter_total_wait_time_ps].width = 10;
}